

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O3

void __thiscall DThinker::ChangeStatNum(DThinker *this,int statnum)

{
  FThinkerList *pFVar1;
  FThinkerList *this_00;
  int iVar2;
  
  if ((this->NextThinker != (DThinker *)0x0) && (this->PrevThinker != (DThinker *)0x0)) {
    iVar2 = 0x7f;
    if ((uint)statnum < 0x7f) {
      iVar2 = statnum;
    }
    Remove(this);
    pFVar1 = (FThinkerList *)((long)&Thinkers[0].Sentinel + (ulong)(uint)(iVar2 << 3));
    this_00 = (FThinkerList *)((long)&FreshThinkers[0].Sentinel + (ulong)(uint)(iVar2 << 3));
    if (((this->super_DObject).ObjectFlags & 0x100) == 0) {
      this_00 = pFVar1;
    }
    if ((uint)statnum < 0x20) {
      this_00 = pFVar1;
    }
    FThinkerList::AddTail(this_00,this);
    return;
  }
  __assert_fail("NextThinker != NULL && PrevThinker != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                ,0x173,"void DThinker::ChangeStatNum(int)");
}

Assistant:

void DThinker::ChangeStatNum (int statnum)
{
	FThinkerList *list;

	// This thinker should already be in a list; verify that.
	assert(NextThinker != NULL && PrevThinker != NULL);

	if ((unsigned)statnum > MAX_STATNUM)
	{
		statnum = MAX_STATNUM;
	}
	Remove();
	if ((ObjectFlags & OF_JustSpawned) && statnum >= STAT_FIRST_THINKING)
	{
		list = &FreshThinkers[statnum];
	}
	else
	{
		list = &Thinkers[statnum];
	}
	list->AddTail(this);
}